

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_image.cpp
# Opt level: O0

int getBytesPerPixel(FE_IMAGE_FORMAT tf)

{
  undefined4 local_c;
  FE_IMAGE_FORMAT tf_local;
  
  if (tf == FE_IMG_A8) {
    local_c = 1;
  }
  else if (tf - FE_IMG_R8G8B8A8 < 2) {
    local_c = 4;
  }
  else if (tf == FE_IMG_DISTANCE) {
    local_c = 0xc;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int getBytesPerPixel(FE_IMAGE_FORMAT tf)
{
    switch (tf)
    {
        case FE_IMG_A8:
            return 1;
        case FE_IMG_B8G8R8A8:
        case FE_IMG_R8G8B8A8:
            return 4;
        case FE_IMG_DISTANCE:
            return sizeof(PixDist);
        default:
            return 0;
    }
    return 0;
}